

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_ptr_queue.hpp
# Opt level: O0

agent_queue_t * __thiscall
so_5::disp::reuse::mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t>::pop
          (mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t> *this,
          condition_t *condition)

{
  bool bVar1;
  type __m;
  reference ppaVar2;
  value_type local_48;
  undefined4 local_40;
  mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t> *local_30;
  value_type r;
  lock_guard<so_5::disp::mpmc_queue_traits::lock_t> lock;
  condition_t *condition_local;
  mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t> *this_local;
  
  lock._M_device = (mutex_type *)condition;
  __m = std::
        unique_ptr<so_5::disp::mpmc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpmc_queue_traits::lock_t>_>
        ::operator*(&this->m_lock);
  std::lock_guard<so_5::disp::mpmc_queue_traits::lock_t>::lock_guard
            ((lock_guard<so_5::disp::mpmc_queue_traits::lock_t> *)&r,__m);
  do {
    if ((this->m_shutdown & 1U) != 0) {
      this_local = (mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t> *)0x0;
LAB_004f78c5:
      local_40 = 1;
      std::lock_guard<so_5::disp::mpmc_queue_traits::lock_t>::~lock_guard
                ((lock_guard<so_5::disp::mpmc_queue_traits::lock_t> *)&r);
      return (agent_queue_t *)this_local;
    }
    bVar1 = std::
            deque<so_5::disp::adv_thread_pool::impl::agent_queue_t_*,_std::allocator<so_5::disp::adv_thread_pool::impl::agent_queue_t_*>_>
            ::empty(&this->m_queue);
    if (!bVar1) {
      ppaVar2 = std::
                deque<so_5::disp::adv_thread_pool::impl::agent_queue_t_*,_std::allocator<so_5::disp::adv_thread_pool::impl::agent_queue_t_*>_>
                ::front(&this->m_queue);
      local_30 = (mpmc_ptr_queue_t<so_5::disp::adv_thread_pool::impl::agent_queue_t> *)*ppaVar2;
      std::
      deque<so_5::disp::adv_thread_pool::impl::agent_queue_t_*,_std::allocator<so_5::disp::adv_thread_pool::impl::agent_queue_t_*>_>
      ::pop_front(&this->m_queue);
      try_wakeup_someone_if_possible(this);
      this_local = local_30;
      goto LAB_004f78c5;
    }
    local_48 = (value_type)lock._M_device;
    std::
    vector<so_5::disp::mpmc_queue_traits::condition_t_*,_std::allocator<so_5::disp::mpmc_queue_traits::condition_t_*>_>
    ::push_back(&this->m_waiting_customers,&local_48);
    (*(lock._M_device)->_vptr_lock_t[2])();
    this->m_wakeup_in_progress = false;
  } while( true );
}

Assistant:

inline T *
		pop( so_5::disp::mpmc_queue_traits::condition_t & condition )
			{
				std::lock_guard< so_5::disp::mpmc_queue_traits::lock_t > lock{ *m_lock };

				do
					{
						if( m_shutdown )
							break;

						if( !m_queue.empty() )
							{
								auto r = m_queue.front();
								m_queue.pop_front();

								// There could be non-empty queue and sleeping workers...
								try_wakeup_someone_if_possible();

								return r;
							}

						m_waiting_customers.push_back( &condition );

						condition.wait();
						// If we are here then the current wakeup procedure is
						// finished.
						m_wakeup_in_progress = false;
					}
				while( true );

				return nullptr;
			}